

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O3

void __thiscall
ui::Renderable::payload<gamespace::EndingScreen::load_ui()::__2&>
          (Renderable *this,anon_class_1_0_00000001 *d)

{
  _Any_data local_28;
  _Manager_type local_18;
  _Invoker_type local_10;
  
  local_28._M_unused._0_8_ =
       (undefined8)*(undefined8 *)&(this->_deleter).super__Function_base._M_functor;
  local_28._8_8_ = *(undefined8 *)((long)&(this->_deleter).super__Function_base._M_functor + 8);
  *(undefined8 *)&(this->_deleter).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->_deleter).super__Function_base._M_functor + 8) = 0;
  local_18 = (this->_deleter).super__Function_base._M_manager;
  (this->_deleter).super__Function_base._M_manager =
       std::
       _Function_handler<void_(void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/game/screens/ending.cpp:44:14)>
       ::_M_manager;
  local_10 = (this->_deleter)._M_invoker;
  (this->_deleter)._M_invoker =
       std::
       _Function_handler<void_(void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/game/screens/ending.cpp:44:14)>
       ::_M_invoke;
  if (local_18 != (_Manager_type)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

void payload(F &&d) {
            _deleter = d;
        }